

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::ShaderHelperInvocationTests::init
          (ShaderHelperInvocationTests *this,EVP_PKEY_CTX *ctx)

{
  PrimitiveType primType_00;
  int numSamples_00;
  Context *pCVar1;
  TestNode *pTVar2;
  HelperInvocationValueCase *this_00;
  char *pcVar3;
  ulong extraout_RAX;
  HelperInvocationDerivateCase *pHVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  int local_dc;
  PrimitiveType local_d8;
  int numSamples_1;
  PrimitiveType primType_1;
  undefined1 local_b0 [8];
  string name_1;
  int primTypeNdx_1;
  int sampleCountNdx_1;
  TestCaseGroup *derivateGroup;
  int numSamples;
  PrimitiveType primType;
  undefined1 local_50 [8];
  string name;
  int local_28;
  int primTypeNdx;
  int sampleCountNdx;
  TestCaseGroup *valueGroup;
  ShaderHelperInvocationTests *this_local;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"value",
             "gl_HelperInvocation value in rendered pixels");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 5;
        name.field_2._12_4_ = name.field_2._12_4_ + 1) {
      pcVar3 = init::s_primTypes[(int)name.field_2._12_4_].caseName;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&primType,pcVar3,(allocator<char> *)((long)&numSamples + 3));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&primType,
                     init::s_sampleCounts[local_28].suffix);
      std::__cxx11::string::~string((string *)&primType);
      std::allocator<char>::~allocator((allocator<char> *)((long)&numSamples + 3));
      primType_00 = init::s_primTypes[(int)name.field_2._12_4_].primType;
      numSamples_00 = init::s_sampleCounts[local_28].numSamples;
      this_00 = (HelperInvocationValueCase *)operator_new(0xb0);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::HelperInvocationValueCase::HelperInvocationValueCase
                (this_00,pCVar1,pcVar3,"",primType_00,numSamples_00);
      tcu::TestNode::addChild(pTVar2,(TestNode *)this_00);
      std::__cxx11::string::~string((string *)local_50);
    }
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"derivate",
             "Derivate of gl_HelperInvocation-dependent value");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  name_1.field_2._12_4_ = 0;
  uVar5 = extraout_RAX;
  while ((int)name_1.field_2._12_4_ < 4) {
    for (name_1.field_2._8_4_ = 0; (int)name_1.field_2._8_4_ < 5;
        name_1.field_2._8_4_ = name_1.field_2._8_4_ + 1) {
      pcVar3 = init::s_primTypes[(int)name_1.field_2._8_4_].caseName;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&primType_1,pcVar3,(allocator<char> *)((long)&numSamples_1 + 3));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &primType_1,init::s_sampleCounts[(int)name_1.field_2._12_4_].suffix);
      std::__cxx11::string::~string((string *)&primType_1);
      std::allocator<char>::~allocator((allocator<char> *)((long)&numSamples_1 + 3));
      local_d8 = init::s_primTypes[(int)name_1.field_2._8_4_].primType;
      local_dc = init::s_sampleCounts[(int)name_1.field_2._12_4_].numSamples;
      pHVar4 = (HelperInvocationDerivateCase *)operator_new(0xd0);
      local_101 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     "_dfdx");
      pcVar3 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::HelperInvocationDerivateCase::HelperInvocationDerivateCase
                (pHVar4,pCVar1,pcVar3,"",local_d8,local_dc,"dFdx",true);
      local_101 = 0;
      tcu::TestNode::addChild(pTVar2,(TestNode *)pHVar4);
      std::__cxx11::string::~string((string *)&local_100);
      pHVar4 = (HelperInvocationDerivateCase *)operator_new(0xd0);
      local_129 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_128,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     "_dfdy");
      pcVar3 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::HelperInvocationDerivateCase::HelperInvocationDerivateCase
                (pHVar4,pCVar1,pcVar3,"",local_d8,local_dc,"dFdy",true);
      local_129 = 0;
      tcu::TestNode::addChild(pTVar2,(TestNode *)pHVar4);
      std::__cxx11::string::~string((string *)&local_128);
      pHVar4 = (HelperInvocationDerivateCase *)operator_new(0xd0);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_150,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     "_fwidth");
      pcVar3 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::HelperInvocationDerivateCase::HelperInvocationDerivateCase
                (pHVar4,pCVar1,pcVar3,"",local_d8,local_dc,"fwidth",false);
      tcu::TestNode::addChild(pTVar2,(TestNode *)pHVar4);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)local_b0);
    }
    name_1.field_2._12_4_ = name_1.field_2._12_4_ + 1;
    uVar5 = (ulong)(uint)name_1.field_2._12_4_;
  }
  return (int)uVar5;
}

Assistant:

void ShaderHelperInvocationTests::init (void)
{
	static const struct
	{
		const char*		caseName;
		PrimitiveType	primType;
	} s_primTypes[] =
	{
		{ "triangles",		PRIMITIVETYPE_TRIANGLE		},
		{ "lines",			PRIMITIVETYPE_LINE			},
		{ "wide_lines",		PRIMITIVETYPE_WIDE_LINE		},
		{ "points",			PRIMITIVETYPE_POINT			},
		{ "wide_points",	PRIMITIVETYPE_WIDE_POINT	}
	};

	static const struct
	{
		const char*		suffix;
		int				numSamples;
	} s_sampleCounts[] =
	{
		{ "",					0				},
		{ "_4_samples",			4				},
		{ "_8_samples",			8				},
		{ "_max_samples",		NUM_SAMPLES_MAX	}
	};

	// value
	{
		tcu::TestCaseGroup* const valueGroup = new tcu::TestCaseGroup(m_testCtx, "value", "gl_HelperInvocation value in rendered pixels");
		addChild(valueGroup);

		for (int sampleCountNdx = 0; sampleCountNdx < DE_LENGTH_OF_ARRAY(s_sampleCounts); sampleCountNdx++)
		{
			for (int primTypeNdx = 0; primTypeNdx < DE_LENGTH_OF_ARRAY(s_primTypes); primTypeNdx++)
			{
				const string		name		= string(s_primTypes[primTypeNdx].caseName) + s_sampleCounts[sampleCountNdx].suffix;
				const PrimitiveType	primType	= s_primTypes[primTypeNdx].primType;
				const int			numSamples	= s_sampleCounts[sampleCountNdx].numSamples;

				valueGroup->addChild(new HelperInvocationValueCase(m_context, name.c_str(), "", primType, numSamples));
			}
		}
	}

	// derivate
	{
		tcu::TestCaseGroup* const derivateGroup = new tcu::TestCaseGroup(m_testCtx, "derivate", "Derivate of gl_HelperInvocation-dependent value");
		addChild(derivateGroup);

		for (int sampleCountNdx = 0; sampleCountNdx < DE_LENGTH_OF_ARRAY(s_sampleCounts); sampleCountNdx++)
		{
			for (int primTypeNdx = 0; primTypeNdx < DE_LENGTH_OF_ARRAY(s_primTypes); primTypeNdx++)
			{
				const string		name		= string(s_primTypes[primTypeNdx].caseName) + s_sampleCounts[sampleCountNdx].suffix;
				const PrimitiveType	primType	= s_primTypes[primTypeNdx].primType;
				const int			numSamples	= s_sampleCounts[sampleCountNdx].numSamples;

				derivateGroup->addChild(new HelperInvocationDerivateCase(m_context, (name + "_dfdx").c_str(),	"", primType, numSamples, "dFdx",	true));
				derivateGroup->addChild(new HelperInvocationDerivateCase(m_context, (name + "_dfdy").c_str(),	"", primType, numSamples, "dFdy",	true));
				derivateGroup->addChild(new HelperInvocationDerivateCase(m_context, (name + "_fwidth").c_str(),	"", primType, numSamples, "fwidth",	false));
			}
		}
	}
}